

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O3

double __thiscall
icu_63::double_conversion::Strtod(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double_conversion **guess_00;
  uint64_t d64;
  double dVar5;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  int updated_exponent;
  double guess;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int *in_stack_fffffffffffffc98;
  undefined1 local_354 [12];
  double_conversion *local_348;
  uint local_340;
  char local_338 [784];
  
  buffer_00._8_8_ = buffer.start_;
  guess_00 = &local_348;
  local_348 = (double_conversion *)0x0;
  local_340 = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess_00,(Vector<const_char> *)local_354,
             in_stack_fffffffffffffc98);
  buffer_01.length_ = local_340;
  buffer_01.start_ = (char *)local_348;
  trimmed_00.start_ = (ulong)local_340;
  trimmed_00.length_ = local_354._0_4_;
  trimmed_00._12_4_ = 0;
  bVar1 = ComputeGuess(local_348,trimmed_00,(int)local_354 + 4,(double *)guess_00);
  dVar5 = (double)local_354._4_8_;
  if (!bVar1) {
    uVar3 = local_354._4_8_ * 2 & 0x1ffffffffffffe;
    bVar1 = (local_354._4_8_ & 0x7ff0000000000000) == 0;
    uVar4 = uVar3 + 0x20000000000000;
    if (bVar1) {
      uVar4 = uVar3;
    }
    uVar3 = 0xfffffbcd;
    if (!bVar1) {
      uVar3 = (ulong)((SUB84(local_354._4_8_,4) >> 0x14 & 0x7ff) - 0x434);
    }
    diy_fp.f_ = uVar4 + 1;
    buffer_01._12_4_ = 0;
    diy_fp._8_8_ = uVar3;
    iVar2 = CompareBufferWithDiyFp(buffer_01,local_354._0_4_,diy_fp);
    if ((-1 < iVar2) && ((iVar2 != 0 || ((local_354._4_8_ & 1) != 0)))) {
      if ((double)local_354._4_8_ == INFINITY) {
        dVar5 = INFINITY;
      }
      else if ((long)local_354._4_8_ < 0) {
        if (((double)local_354._4_8_ != 0.0) || (dVar5 = 0.0, NAN((double)local_354._4_8_))) {
          dVar5 = (double)(local_354._4_8_ + -1);
        }
      }
      else {
        dVar5 = (double)(local_354._4_8_ + 1);
      }
    }
  }
  return dVar5;
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) return guess;

  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}